

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

int Abc_SclObjCheckMarkedFanFans(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  
  if ((*(uint *)&pObj->field_0x14 >> 5 & 1) == 0) {
    for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = Abc_ObjFanin(pObj,local_24);
      if ((*(uint *)&pAVar2->field_0x14 >> 5 & 1) != 0) {
        return 1;
      }
    }
    for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pObj), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = Abc_ObjFanout(pObj,local_24);
      if ((*(uint *)&pAVar2->field_0x14 >> 5 & 1) != 0) {
        return 1;
      }
    }
    pObj_local._4_4_ = 0;
  }
  else {
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_SclObjCheckMarkedFanFans( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pNext;
    int i;
    if ( pObj->fMarkB )
        return 1;
    Abc_ObjForEachFanin( pObj, pNext, i )
        if ( pNext->fMarkB )
            return 1;
    Abc_ObjForEachFanout( pObj, pNext, i )
        if ( pNext->fMarkB )
            return 1;
    return 0;
}